

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadSignatureTypeSection(WasmBinaryReader *this)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  WasmType WVar4;
  uint count;
  uint sourceContextId;
  LocalFunctionId functionId;
  WasmSignature *this_00;
  Recycler *pRVar5;
  char16_t *msg;
  WasmBinaryReader *pWVar6;
  FunctionBody *pFVar7;
  ArgSlot j;
  ArgSlot index;
  uint32 uVar8;
  uint32 local_3c;
  uint32 local_38;
  uint32 len;
  
  local_3c = 0;
  pWVar6 = this;
  len = LEB128<unsigned_int,32u>(this,&local_3c);
  if ((len < 0xf4241) || (DAT_01430302 != 0)) {
    Js::WebAssemblyModule::SetSignatureCount(this->m_module,len);
    uVar8 = 0;
    while( true ) {
      if (uVar8 == len) {
        return;
      }
      this_00 = Js::WebAssemblyModule::GetSignature(this->m_module,uVar8);
      WasmSignature::SetSignatureId(this_00,uVar8);
      pWVar6 = this;
      cVar1 = LEB128<char,7u>(this,&local_3c);
      if (cVar1 != -0x20) {
        ThrowDecodingError(pWVar6,L"Unexpected type form 0x%X",(ulong)(uint)(int)cVar1);
      }
      pWVar6 = this;
      local_38 = uVar8;
      uVar3 = LEB128<unsigned_int,32u>(this,&local_3c);
      if ((0xffff < uVar3) || ((1000 < uVar3 & (DAT_01430302 ^ 1)) != 0)) break;
      pRVar5 = Js::RecyclableObject::GetRecycler((RecyclableObject *)this->m_module);
      WasmSignature::AllocateParams(this_00,(ArgSlot)uVar3,pRVar5);
      for (index = 0; index < (ArgSlot)uVar3; index = index + 1) {
        WVar4 = ReadWasmType(this,&local_3c);
        WasmSignature::SetParam(this_00,WVar4,index);
      }
      pWVar6 = this;
      count = LEB128<unsigned_int,32u>(this,&local_3c);
      uVar3 = 10000;
      if ((DAT_01430302 & 1) != 0) {
        uVar3 = 0xfffffffe;
      }
      if (DAT_0143030d == '\0') {
        uVar3 = 1;
      }
      if (uVar3 < count) {
        ThrowDecodingError(pWVar6,L"Too many returns in signature: %u. Maximum allowed: %u",
                           (ulong)count);
      }
      pRVar5 = Js::RecyclableObject::GetRecycler((RecyclableObject *)this->m_module);
      WasmSignature::AllocateResults(this_00,count,pRVar5);
      for (uVar8 = 0; count != uVar8; uVar8 = uVar8 + 1) {
        WVar4 = ReadWasmType(this,&local_3c);
        WasmSignature::SetResult(this_00,WVar4,uVar8);
      }
      WasmSignature::FinalizeSignature(this_00);
      pFVar7 = (this->m_funcState).body;
      if (pFVar7 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmReaderPhase);
        uVar8 = local_38;
        if (bVar2) {
LAB_00d631dd:
          Output::Print(L"Signature #%u: ",(ulong)uVar8);
          WasmSignature::Dump(this_00,0x200);
          Output::Print(L"\n");
        }
      }
      else {
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
        uVar8 = local_38;
        if (this->m_readerState == READER_STATE_FUNCTION) {
          pFVar7 = (this->m_funcState).body;
        }
        else {
          pFVar7 = (FunctionBody *)0x0;
        }
        functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar7);
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_01453738,WasmReaderPhase,sourceContextId,functionId);
        if (bVar2) goto LAB_00d631dd;
      }
      uVar8 = uVar8 + 1;
    }
    msg = L"Too many arguments in signature";
  }
  else {
    msg = L"Too many signatures";
  }
  ThrowDecodingError(pWVar6,msg);
}

Assistant:

void WasmBinaryReader::ReadSignatureTypeSection()
{
    uint32 len = 0;
    const uint32 numTypes = LEB128(len);
    if (numTypes > Limits::GetMaxTypes())
    {
        ThrowDecodingError(_u("Too many signatures"));
    }

    m_module->SetSignatureCount(numTypes);
    // signatures table
    for (uint32 i = 0; i < numTypes; i++)
    {
        WasmSignature* sig = m_module->GetSignature(i);
        sig->SetSignatureId(i);
        int8 form = SLEB128<int8, 7>(len);
        if (form != LanguageTypes::func)
        {
            ThrowDecodingError(_u("Unexpected type form 0x%X"), form);
        }

        uint32 paramCount32 = LEB128(len);
        if (paramCount32 > Limits::GetMaxFunctionParams() || paramCount32 > UINT16_MAX)
        {
            ThrowDecodingError(_u("Too many arguments in signature"));
        }

        Js::ArgSlot paramCount = (Js::ArgSlot)paramCount32;
        sig->AllocateParams(paramCount, m_module->GetRecycler());
        for (Js::ArgSlot j = 0; j < paramCount; j++)
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            sig->SetParam(type, j);
        }

        uint32 resultCount = LEB128(len);
        if (resultCount > Limits::GetMaxFunctionReturns())
        {
            ThrowDecodingError(_u("Too many returns in signature: %u. Maximum allowed: %u"), resultCount, Limits::GetMaxFunctionReturns());
        }
        sig->AllocateResults(resultCount, m_module->GetRecycler());
        for (uint32 iResult = 0; iResult < resultCount; ++iResult)
        {
            WasmTypes::WasmType type = ReadWasmType(len);
            sig->SetResult(type, iResult);
        }
        sig->FinalizeSignature();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (DO_WASM_TRACE_DECODER)
        {
            Output::Print(_u("Signature #%u: "), i);
            sig->Dump();
            Output::Print(_u("\n"));
        }
#endif
    }
}